

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O1

void __thiscall
TPZStructMatrixOT<double>::TPZStructMatrixOT
          (TPZStructMatrixOT<double> *this,TPZStructMatrixOT<double> *copy)

{
  long lVar1;
  
  *(undefined ***)this = &PTR__TPZSavable_019cc1e0;
  lVar1 = *(long *)(*(long *)copy + -0x60);
  *(undefined8 *)&this->field_0x80 = 0x19cc078;
  *(undefined8 *)this = 0x19cc140;
  *(undefined4 *)&this->field_0x88 = *(undefined4 *)((long)&(copy->fElBlocked)._vptr_TPZVec + lVar1)
  ;
  this->field_0x8c = *(undefined1 *)((long)&(copy->fElBlocked)._vptr_TPZVec + lVar1 + 4);
  *(undefined8 *)this = 0x19cbba8;
  *(undefined8 *)&this->field_0x80 = 0x19cbcb0;
  TPZVec<long>::TPZVec(&this->fElBlocked,&copy->fElBlocked);
  TPZVec<long>::TPZVec(&this->fElSequenceColor,&copy->fElSequenceColor);
  TPZVec<long>::TPZVec(&this->fElementsComputed,&copy->fElementsComputed);
  this->fElementCompleted = copy->fElementCompleted;
  return;
}

Assistant:

TPZStructMatrixOT<TVar>::TPZStructMatrixOT(const TPZStructMatrixOT &copy) :
    TPZStrMatParInterface(copy),
    fElBlocked(copy.fElBlocked),
    fElSequenceColor(copy.fElSequenceColor),
    fElementsComputed(copy.fElementsComputed),
    fElementCompleted(copy.fElementCompleted)
    //fSomeoneisSleeping //no need
    //fCurrentIndex //no need
{
}